

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O3

int __thiscall xs::MessageParser::get<int>(MessageParser *this)

{
  ulong uVar1;
  uint uVar2;
  Error *this_00;
  
  uVar1 = this->m_pos + 4;
  if (uVar1 <= this->m_size) {
    uVar2 = *(uint *)(this->m_data + this->m_pos);
    this->m_pos = uVar1;
    return uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x10);
  Error::Error(this_00,"Invalid payload size","m_pos + sizeof(T) <= m_size",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/xsProtocol.cpp"
               ,0x3c);
  __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T get (void)
	{
		XS_CHECK_MSG(m_pos + sizeof(T) <= m_size, "Invalid payload size");
		T netValue;
		deMemcpy(&netValue, &m_data[m_pos], sizeof(T));
		m_pos += sizeof(T);
		return networkToHost(netValue);
	}